

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int compare_dir_entries(void *p1,void *p2,void *arg)

{
  int local_5c;
  int local_58;
  int local_54;
  de *local_50;
  int local_44;
  int cmp_result;
  de *b;
  de *a;
  char *query_string;
  void *arg_local;
  void *p2_local;
  void *p1_local;
  
  local_50 = (de *)arg;
  if (arg == (void *)0x0) {
    local_50 = (de *)0x16ccb7;
  }
  a = local_50;
  if ((p1 == (void *)0x0) || (p2 == (void *)0x0)) {
    p1_local._4_4_ = 0;
  }
  else {
    local_44 = 0;
    if ((local_50 == (de *)0x0) || (*(char *)&local_50->file_name == '\0')) {
      a = (de *)0x16ead7;
    }
    if ((*(int *)((long)p1 + 0x18) == 0) || (*(int *)((long)p2 + 0x18) != 0)) {
      if ((*(int *)((long)p1 + 0x18) == 0) && (*(int *)((long)p2 + 0x18) != 0)) {
        p1_local._4_4_ = 1;
      }
      else {
        if (*(char *)&a->file_name == 's') {
          if (*(long *)((long)p1 + 8) == *(long *)((long)p2 + 8)) {
            local_54 = 0;
          }
          else {
            local_54 = -1;
            if (*(ulong *)((long)p2 + 8) < *(ulong *)((long)p1 + 8)) {
              local_54 = 1;
            }
          }
          local_44 = local_54;
        }
        else if (*(char *)&a->file_name == 'd') {
          if (*(long *)((long)p1 + 0x10) == *(long *)((long)p2 + 0x10)) {
            local_58 = 0;
          }
          else {
            local_58 = -1;
            if (*(long *)((long)p2 + 0x10) < *(long *)((long)p1 + 0x10)) {
              local_58 = 1;
            }
          }
          local_44 = local_58;
        }
        if (local_44 == 0) {
          local_44 = strcmp(*p1,*p2);
        }
        if (*(char *)((long)&a->file_name + 1) == 'd') {
          local_5c = -local_44;
        }
        else {
          local_5c = local_44;
        }
        p1_local._4_4_ = local_5c;
      }
    }
    else {
      p1_local._4_4_ = -1;
    }
  }
  return p1_local._4_4_;
}

Assistant:

static int
compare_dir_entries(const void *p1, const void *p2, void *arg)
{
	const char *query_string = (const char *)(arg != NULL ? arg : "");
	if (p1 && p2) {
		const struct de *a = (const struct de *)p1, *b = (const struct de *)p2;
		int cmp_result = 0;

		if ((query_string == NULL) || (query_string[0] == '\0')) {
			query_string = "n";
		}

		/* Sort Directories vs Files */
		if (a->file.is_directory && !b->file.is_directory) {
			return -1; /* Always put directories on top */
		} else if (!a->file.is_directory && b->file.is_directory) {
			return 1; /* Always put directories on top */
		}

		/* Sort by size or date */
		if (*query_string == 's') {
			cmp_result = (a->file.size == b->file.size)
			                 ? 0
			                 : ((a->file.size > b->file.size) ? 1 : -1);
		} else if (*query_string == 'd') {
			cmp_result =
			    (a->file.last_modified == b->file.last_modified)
			        ? 0
			        : ((a->file.last_modified > b->file.last_modified) ? 1
			                                                           : -1);
		}

		/* Sort by name:
		 * if (*query_string == 'n')  ...
		 * but also sort files of same size/date by name as secondary criterion.
		 */
		if (cmp_result == 0) {
			cmp_result = strcmp(a->file_name, b->file_name);
		}

		/* For descending order, invert result */
		return (query_string[1] == 'd') ? -cmp_result : cmp_result;
	}
	return 0;
}